

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtract.cpp
# Opt level: O1

bool duckdb::TryDecimalSubtract::Operation<long,long,long>
               (int64_t left,int64_t right,int64_t *result)

{
  if (right < 0) {
    if (left <= right + 999999999999999999) goto LAB_01447e72;
  }
  else if (right + -999999999999999999 <= left) {
LAB_01447e72:
    *result = left - right;
    return true;
  }
  return false;
}

Assistant:

bool TryDecimalSubtractTemplated(T left, T right, T &result) {
	if (right < 0) {
		if (max + right < left) {
			return false;
		}
	} else {
		if (min + right > left) {
			return false;
		}
	}
	result = left - right;
	return true;
}